

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,java *this,FieldDescriptor *field)

{
  float value;
  double value_00;
  string *text;
  bool bVar1;
  LogMessage *other;
  char *__s;
  SubstituteArg *this_00;
  SubstituteArg local_1f0;
  undefined1 local_1c0 [32];
  SubstituteArg local_1a0;
  SubstituteArg local_170;
  SubstituteArg local_140;
  SubstituteArg local_110;
  SubstituteArg local_e0;
  SubstituteArg local_b0;
  SubstituteArg local_80;
  SubstituteArg local_50;
  
  this_00 = (SubstituteArg *)&stack0xfffffffffffffdd8;
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(this + 0x2c) * 4)) {
  case 1:
  case 3:
    SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)*(uint *)(this + 0x70),0x23b4d0)
    ;
    return __return_storage_ptr__;
  case 2:
    SimpleItoa_abi_cxx11_((string *)&stack0xfffffffffffffdd8,*(protobuf **)(this + 0x70),0x23b4d0);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffdd8,"L");
    break;
  case 4:
    SimpleItoa_abi_cxx11_((string *)&stack0xfffffffffffffdd8,*(protobuf **)(this + 0x70),0x23b4d0);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffdd8,"L");
    this_00 = (SubstituteArg *)&stack0xfffffffffffffdd8;
    break;
  case 5:
    value_00 = *(double *)(this + 0x70);
    if (value_00 < INFINITY) {
      if (-INFINITY < value_00) {
        if (!NAN(value_00)) {
          SimpleDtoa_abi_cxx11_((string *)&stack0xfffffffffffffdd8,(protobuf *)this,value_00);
          std::operator+(__return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xfffffffffffffdd8,"D");
          this_00 = (SubstituteArg *)&stack0xfffffffffffffdd8;
          break;
        }
        __s = "Double.NaN";
      }
      else {
        __s = "Double.NEGATIVE_INFINITY";
      }
    }
    else {
      __s = "Double.POSITIVE_INFINITY";
    }
    goto LAB_001be7e6;
  case 6:
    value = *(float *)(this + 0x70);
    if (value < INFINITY) {
      if (-INFINITY < value) {
        if (!NAN(value)) {
          SimpleFtoa_abi_cxx11_((string *)&stack0xfffffffffffffdd8,(protobuf *)this,value);
          std::operator+(__return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xfffffffffffffdd8,"F");
          this_00 = (SubstituteArg *)&stack0xfffffffffffffdd8;
          break;
        }
        __s = "Float.NaN";
      }
      else {
        __s = "Float.NEGATIVE_INFINITY";
      }
    }
    else {
      __s = "Float.POSITIVE_INFINITY";
    }
    goto LAB_001be7e6;
  case 7:
    __s = "false";
    if (this[0x70] != (java)0x0) {
      __s = "true";
    }
    goto LAB_001be7e6;
  case 8:
    ClassName_abi_cxx11_
              ((string *)&local_1f0,*(java **)(this + 0x50),
               (EnumDescriptor *)&switchD_001be501::switchdataD_0023b4d0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffdd8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f0,
                   ".");
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffdd8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   **(undefined8 **)(this + 0x70));
LAB_001be5d8:
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
    this_00 = &local_1f0;
    break;
  case 9:
    if (*(uint *)(this + 0x2c) == 0xc) {
      if (this[0x68] != (java)0x1) {
        __s = "com.google.protobuf.ByteString.EMPTY";
        goto LAB_001be7e6;
      }
      CEscape((string *)local_1c0,*(string **)(this + 0x70));
      local_1f0.text_ = (char *)0x0;
      local_1f0.size_ = -1;
      local_50.text_ = (char *)0x0;
      local_50.size_ = -1;
      local_80.text_ = (char *)0x0;
      local_80.size_ = -1;
      local_b0.text_ = (char *)0x0;
      local_b0.size_ = -1;
      local_e0.text_ = (char *)0x0;
      local_e0.size_ = -1;
      local_110.text_ = (char *)0x0;
      local_110.size_ = -1;
      local_140.text_ = (char *)0x0;
      local_140.size_ = -1;
      local_170.text_ = (char *)0x0;
      local_170.size_ = -1;
      local_1a0.text_ = (char *)0x0;
      local_1a0.size_ = -1;
      strings::Substitute_abi_cxx11_
                (__return_storage_ptr__,
                 (strings *)"com.google.protobuf.Internal.bytesDefaultValue(\"$0\")",
                 &stack0xfffffffffffffdd8,&local_1f0,&local_50,&local_80,&local_b0,&local_e0,
                 &local_110,&local_140,&local_170,&local_1a0,(SubstituteArg *)local_1c0._0_8_);
    }
    else {
      text = *(string **)(this + 0x70);
      bVar1 = AllAscii(text);
      if (bVar1) {
        CEscape((string *)&local_1f0,text);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xfffffffffffffdd8,"\"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1f0);
        std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xfffffffffffffdd8,"\"");
        goto LAB_001be5d8;
      }
      CEscape((string *)local_1c0,text);
      local_1f0.text_ = (char *)0x0;
      local_1f0.size_ = -1;
      local_50.text_ = (char *)0x0;
      local_50.size_ = -1;
      local_80.text_ = (char *)0x0;
      local_80.size_ = -1;
      local_b0.text_ = (char *)0x0;
      local_b0.size_ = -1;
      local_e0.text_ = (char *)0x0;
      local_e0.size_ = -1;
      local_110.text_ = (char *)0x0;
      local_110.size_ = -1;
      local_140.text_ = (char *)0x0;
      local_140.size_ = -1;
      local_170.text_ = (char *)0x0;
      local_170.size_ = -1;
      local_1a0.text_ = (char *)0x0;
      local_1a0.size_ = -1;
      strings::Substitute_abi_cxx11_
                (__return_storage_ptr__,
                 (strings *)"com.google.protobuf.Internal.stringDefaultValue(\"$0\")",
                 &stack0xfffffffffffffdd8,&local_1f0,&local_50,&local_80,&local_b0,&local_e0,
                 &local_110,&local_140,&local_170,&local_1a0,(SubstituteArg *)local_1c0._0_8_);
    }
    this_00 = (SubstituteArg *)local_1c0;
    break;
  case 10:
    ClassName_abi_cxx11_
              ((string *)&stack0xfffffffffffffdd8,*(java **)(this + 0x48),
               (Descriptor *)&switchD_001be501::switchdataD_0023b4d0);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffdd8,".getDefaultInstance()");
    this_00 = (SubstituteArg *)&stack0xfffffffffffffdd8;
    break;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)&stack0xfffffffffffffdd8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/java/java_helpers.cc"
               ,0x165);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)&stack0xfffffffffffffdd8,"Can\'t get here.");
    internal::LogFinisher::operator=((LogFinisher *)&local_1f0,other);
    internal::LogMessage::~LogMessage((LogMessage *)&stack0xfffffffffffffdd8);
    __s = "";
LAB_001be7e6:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)&stack0xfffffffffffffdd8);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

string DefaultValue(const FieldDescriptor* field) {
  // Switch on CppType since we need to know which default_value_* method
  // of FieldDescriptor to call.
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return SimpleItoa(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      // Need to print as a signed int since Java has no unsigned.
      return SimpleItoa(static_cast<int32>(field->default_value_uint32()));
    case FieldDescriptor::CPPTYPE_INT64:
      return SimpleItoa(field->default_value_int64()) + "L";
    case FieldDescriptor::CPPTYPE_UINT64:
      return SimpleItoa(static_cast<int64>(field->default_value_uint64())) +
             "L";
    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value = field->default_value_double();
      if (value == numeric_limits<double>::infinity()) {
        return "Double.POSITIVE_INFINITY";
      } else if (value == -numeric_limits<double>::infinity()) {
        return "Double.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Double.NaN";
      } else {
        return SimpleDtoa(value) + "D";
      }
    }
    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value = field->default_value_float();
      if (value == numeric_limits<float>::infinity()) {
        return "Float.POSITIVE_INFINITY";
      } else if (value == -numeric_limits<float>::infinity()) {
        return "Float.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Float.NaN";
      } else {
        return SimpleFtoa(value) + "F";
      }
    }
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_STRING:
      if (GetType(field) == FieldDescriptor::TYPE_BYTES) {
        if (field->has_default_value()) {
          // See comments in Internal.java for gory details.
          return strings::Substitute(
            "com.google.protobuf.Internal.bytesDefaultValue(\"$0\")",
            CEscape(field->default_value_string()));
        } else {
          return "com.google.protobuf.ByteString.EMPTY";
        }
      } else {
        if (AllAscii(field->default_value_string())) {
          // All chars are ASCII.  In this case CEscape() works fine.
          return "\"" + CEscape(field->default_value_string()) + "\"";
        } else {
          // See comments in Internal.java for gory details.
          return strings::Substitute(
              "com.google.protobuf.Internal.stringDefaultValue(\"$0\")",
              CEscape(field->default_value_string()));
        }
      }

    case FieldDescriptor::CPPTYPE_ENUM:
      return ClassName(field->enum_type()) + "." +
          field->default_value_enum()->name();

    case FieldDescriptor::CPPTYPE_MESSAGE:
      return ClassName(field->message_type()) + ".getDefaultInstance()";

    // No default because we want the compiler to complain if any new
    // types are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return "";
}